

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  stbi_uc *psVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  ulong uVar24;
  long lVar25;
  stbi_uc *psVar26;
  byte *pbVar27;
  uint uVar28;
  long lVar29;
  stbi_uc *psVar30;
  byte *pbVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long in_FS_OFFSET;
  bool bVar35;
  ulong local_c0;
  ulong local_70;
  ulong uVar23;
  
  bVar35 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar35;
  a_00 = a->s->img_n;
  lVar32 = (long)a_00;
  uVar34 = (ulong)(uint)(a_00 << bVar35);
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar35,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    pcVar9 = "outofmem";
  }
  else {
    iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar6 == 0) {
      pcVar9 = "too large";
    }
    else {
      iVar6 = a_00 * x;
      uVar22 = iVar6 * depth + 7U >> 3;
      uVar23 = (ulong)uVar22;
      if ((uVar22 + 1) * y <= raw_len) {
        if (y != 0) {
          lVar33 = -(ulong)uVar5;
          lVar29 = (long)(out_n << bVar35);
          iVar7 = x - 1;
          lVar19 = -lVar29;
          uVar11 = 0;
          local_c0 = 0;
          local_70 = (ulong)x;
          do {
            pbVar31 = raw + 1;
            bVar2 = *raw;
            if ((ulong)bVar2 < 5) {
              psVar8 = a->out + uVar5 * (int)local_c0;
              if (depth < 8) {
                if (x < uVar22) {
                  *(char **)(in_FS_OFFSET + -0x408) = "invalid width";
                  bVar35 = false;
                  goto LAB_001654a1;
                }
                psVar8 = psVar8 + (uVar4 - uVar22);
                uVar34 = 1;
                local_70 = uVar23;
              }
              if (local_c0 == 0) {
                bVar2 = ""[bVar2];
              }
              iVar16 = (int)uVar34;
              if (0 < iVar16) {
                uVar24 = 0;
                do {
                  switch(bVar2) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar3 = pbVar31[uVar24];
                    goto LAB_00164f58;
                  case 2:
                  case 4:
                    bVar3 = psVar8[uVar24 + lVar33];
                    break;
                  case 3:
                    bVar3 = psVar8[uVar24 + lVar33] >> 1;
                    break;
                  default:
                    goto switchD_00164f3e_default;
                  }
                  bVar3 = bVar3 + pbVar31[uVar24];
LAB_00164f58:
                  psVar8[uVar24] = bVar3;
switchD_00164f3e_default:
                  uVar24 = uVar24 + 1;
                } while (uVar34 != uVar24);
              }
              if (depth == 8) {
                lVar25 = (long)out_n;
                lVar21 = lVar32;
                if (a_00 != out_n) {
                  psVar8[lVar32] = 0xff;
                }
LAB_00164fa5:
                pbVar31 = pbVar31 + lVar21;
              }
              else {
                if (depth == 0x10) {
                  lVar21 = (long)iVar16;
                  lVar25 = lVar29;
                  if (a_00 != out_n) {
                    (psVar8 + lVar21)[0] = 0xff;
                    (psVar8 + lVar21)[1] = 0xff;
                  }
                  goto LAB_00164fa5;
                }
                pbVar31 = raw + 2;
                lVar25 = 1;
              }
              psVar30 = psVar8 + lVar25;
              if (a_00 == out_n || depth < 8) {
                uVar10 = ((int)local_70 + -1) * iVar16;
                switch(bVar2) {
                case 0:
                  memcpy(psVar30,pbVar31,(long)(int)uVar10);
                  break;
                case 1:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar30[uVar24] = psVar8[uVar24 + (lVar25 - iVar16)] + pbVar31[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar10 != uVar24);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar30[uVar24] = psVar30[uVar24 + lVar33] + pbVar31[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar10 != uVar24);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar30[uVar24] =
                           (char)((uint)psVar8[uVar24 + (lVar25 - iVar16)] +
                                  (uint)psVar30[uVar24 + lVar33] >> 1) + pbVar31[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar10 != uVar24);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar10) {
                    pbVar27 = psVar8 + (lVar25 - iVar16);
                    uVar24 = 0;
                    do {
                      bVar2 = *pbVar27;
                      bVar3 = psVar30[lVar33];
                      bVar13 = pbVar27[lVar33];
                      iVar16 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar13;
                      uVar28 = iVar16 - (uint)bVar2;
                      uVar15 = -uVar28;
                      if (0 < (int)uVar28) {
                        uVar15 = uVar28;
                      }
                      uVar14 = iVar16 - (uint)bVar3;
                      uVar28 = -uVar14;
                      if (0 < (int)uVar14) {
                        uVar28 = uVar14;
                      }
                      uVar17 = iVar16 - (uint)bVar13;
                      uVar14 = -uVar17;
                      if (0 < (int)uVar17) {
                        uVar14 = uVar17;
                      }
                      if (uVar28 <= uVar14) {
                        bVar13 = bVar3;
                      }
                      if (uVar14 < uVar15) {
                        bVar2 = bVar13;
                      }
                      if (uVar28 < uVar15) {
                        bVar2 = bVar13;
                      }
                      *psVar30 = bVar2 + pbVar31[uVar24];
                      uVar24 = uVar24 + 1;
                      pbVar27 = pbVar27 + 1;
                      psVar30 = psVar30 + 1;
                    } while (uVar10 != uVar24);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar30[uVar24] = (psVar8[uVar24 + (lVar25 - iVar16)] >> 1) + pbVar31[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar10 != uVar24);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar30[uVar24] = psVar8[uVar24 + (lVar25 - iVar16)] + pbVar31[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar10 != uVar24);
                  }
                }
                pbVar31 = pbVar31 + (int)uVar10;
              }
              else {
                switch(bVar2) {
                case 0:
                  if (iVar7 != 0) {
                    iVar20 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar24 = 0;
                        do {
                          psVar30[uVar24] = pbVar31[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar34 != uVar24);
                      }
                      psVar30[iVar16] = 0xff;
                      pbVar31 = pbVar31 + iVar16;
                      psVar30 = psVar30 + lVar29;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 1:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar25 + lVar19;
                    iVar20 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar24 = 0;
                        do {
                          psVar30[uVar24] = psVar8[uVar24] + pbVar31[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar34 != uVar24);
                      }
                      psVar30[iVar16] = 0xff;
                      pbVar31 = pbVar31 + iVar16;
                      psVar30 = psVar30 + lVar29;
                      psVar8 = psVar8 + lVar29;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 2:
                  if (iVar7 != 0) {
                    iVar20 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar24 = 0;
                        do {
                          psVar30[uVar24] = psVar30[uVar24 + lVar33] + pbVar31[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar34 != uVar24);
                      }
                      psVar30[iVar16] = 0xff;
                      pbVar31 = pbVar31 + iVar16;
                      psVar30 = psVar30 + lVar29;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 3:
                  if (iVar7 != 0) {
                    iVar20 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar24 = 0;
                        psVar8 = psVar30;
                        do {
                          *psVar8 = (char)((uint)psVar8[lVar19] + (uint)psVar8[lVar33] >> 1) +
                                    pbVar31[uVar24];
                          uVar24 = uVar24 + 1;
                          psVar8 = psVar8 + 1;
                        } while (uVar34 != uVar24);
                      }
                      psVar30[iVar16] = 0xff;
                      pbVar31 = pbVar31 + iVar16;
                      psVar30 = psVar30 + lVar29;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 4:
                  if (iVar7 != 0) {
                    psVar12 = psVar8 + lVar25 + lVar33;
                    psVar26 = psVar8 + lVar25 + lVar19;
                    psVar8 = psVar8 + lVar25 + (lVar19 - (ulong)uVar5);
                    iVar20 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar24 = 0;
                        do {
                          bVar2 = psVar26[uVar24];
                          bVar3 = psVar12[uVar24];
                          bVar13 = psVar8[uVar24];
                          iVar18 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar13;
                          uVar15 = iVar18 - (uint)bVar2;
                          uVar10 = -uVar15;
                          if (0 < (int)uVar15) {
                            uVar10 = uVar15;
                          }
                          uVar28 = iVar18 - (uint)bVar3;
                          uVar15 = -uVar28;
                          if (0 < (int)uVar28) {
                            uVar15 = uVar28;
                          }
                          uVar14 = iVar18 - (uint)bVar13;
                          uVar28 = -uVar14;
                          if (0 < (int)uVar14) {
                            uVar28 = uVar14;
                          }
                          if (uVar15 <= uVar28) {
                            bVar13 = bVar3;
                          }
                          if (uVar28 < uVar10) {
                            bVar2 = bVar13;
                          }
                          if (uVar15 < uVar10) {
                            bVar2 = bVar13;
                          }
                          psVar30[uVar24] = bVar2 + pbVar31[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar34 != uVar24);
                      }
                      psVar30[iVar16] = 0xff;
                      pbVar31 = pbVar31 + iVar16;
                      psVar30 = psVar30 + lVar29;
                      psVar12 = psVar12 + lVar29;
                      psVar26 = psVar26 + lVar29;
                      psVar8 = psVar8 + lVar29;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 5:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar25 + lVar19;
                    iVar20 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar24 = 0;
                        do {
                          psVar30[uVar24] = (psVar8[uVar24] >> 1) + pbVar31[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar34 != uVar24);
                      }
                      psVar30[iVar16] = 0xff;
                      pbVar31 = pbVar31 + iVar16;
                      psVar30 = psVar30 + lVar29;
                      psVar8 = psVar8 + lVar29;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 6:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar25 + lVar19;
                    iVar20 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar24 = 0;
                        do {
                          psVar30[uVar24] = psVar8[uVar24] + pbVar31[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar34 != uVar24);
                      }
                      psVar30[iVar16] = 0xff;
                      pbVar31 = pbVar31 + iVar16;
                      psVar30 = psVar30 + lVar29;
                      psVar8 = psVar8 + lVar29;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                }
                bVar35 = true;
                if (depth == 0x10) {
                  if (x != 0) {
                    psVar8 = a->out + (long)iVar16 + (ulong)uVar11 + 1;
                    uVar24 = (ulong)x;
                    do {
                      *psVar8 = 0xff;
                      psVar8 = psVar8 + lVar29;
                      uVar10 = (int)uVar24 - 1;
                      uVar24 = (ulong)uVar10;
                    } while (uVar10 != 0);
                  }
                  goto LAB_001654a1;
                }
              }
              bVar35 = true;
            }
            else {
              *(char **)(in_FS_OFFSET + -0x408) = "invalid filter";
              bVar35 = false;
            }
LAB_001654a1:
            if (!bVar35) {
              return 0;
            }
            local_c0 = local_c0 + 1;
            uVar11 = uVar11 + uVar5;
            raw = pbVar31;
          } while (local_c0 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar4 * y != 0) {
            psVar8 = a->out;
            lVar32 = 0;
            do {
              puVar1 = (ushort *)(psVar8 + lVar32 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar32 = lVar32 + 1;
            } while (uVar4 * y != (int)lVar32);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar22 = x - 1;
        lVar32 = uVar4 - uVar23;
        lVar19 = (ulong)uVar22 + 1;
        uVar11 = 0;
        uVar34 = 0;
        do {
          bVar2 = 1;
          if (color == 0) {
            bVar2 = ""[depth];
          }
          psVar8 = a->out;
          pbVar27 = psVar8 + uVar5 * (int)uVar34;
          pbVar31 = pbVar27 + (uVar4 - uVar23);
          uVar24 = (ulong)uVar11;
          if (depth == 4) {
            iVar7 = iVar6;
            if (1 < iVar6) {
              psVar30 = psVar8 + lVar32;
              iVar16 = iVar6;
              do {
                psVar8[uVar24] = (psVar30[uVar24] >> 4) * bVar2;
                psVar8[uVar24 + 1] = (psVar30[uVar24] & 0xf) * bVar2;
                iVar7 = iVar16 + -2;
                psVar30 = psVar30 + 1;
                psVar8 = psVar8 + 2;
                bVar35 = 3 < iVar16;
                iVar16 = iVar7;
              } while (bVar35);
              pbVar31 = psVar30 + uVar24;
              pbVar27 = psVar8 + uVar24;
            }
            if (iVar7 == 1) {
              bVar3 = *pbVar31 >> 4;
LAB_001657d5:
              bVar2 = bVar3 * bVar2;
LAB_001657d8:
              *pbVar27 = bVar2;
            }
          }
          else if (depth == 2) {
            iVar7 = iVar6;
            if (3 < iVar6) {
              psVar30 = psVar8 + lVar32;
              iVar16 = iVar6;
              do {
                psVar8[uVar24] = (psVar30[uVar24] >> 6) * bVar2;
                psVar8[uVar24 + 1] = (psVar30[uVar24] >> 4 & 3) * bVar2;
                psVar8[uVar24 + 2] = (psVar30[uVar24] >> 2 & 3) * bVar2;
                psVar8[uVar24 + 3] = (psVar30[uVar24] & 3) * bVar2;
                iVar7 = iVar16 + -4;
                psVar30 = psVar30 + 1;
                psVar8 = psVar8 + 4;
                bVar35 = 7 < iVar16;
                iVar16 = iVar7;
              } while (bVar35);
              pbVar31 = psVar30 + uVar24;
              pbVar27 = psVar8 + uVar24;
            }
            if (0 < iVar7) {
              *pbVar27 = (*pbVar31 >> 6) * bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (1 < iVar7) {
              *pbVar27 = (*pbVar31 >> 4 & 3) * bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (iVar7 == 3) {
              bVar3 = *pbVar31 >> 2 & 3;
              goto LAB_001657d5;
            }
          }
          else if (depth == 1) {
            iVar7 = iVar6;
            if (7 < iVar6) {
              psVar30 = psVar8 + lVar32;
              iVar16 = iVar6;
              do {
                psVar8[uVar24] = (char)psVar30[uVar24] >> 7 & bVar2;
                psVar8[uVar24 + 1] = (char)(psVar30[uVar24] * '\x02') >> 7 & bVar2;
                psVar8[uVar24 + 2] = (char)(psVar30[uVar24] << 2) >> 7 & bVar2;
                psVar8[uVar24 + 3] = (char)(psVar30[uVar24] << 3) >> 7 & bVar2;
                psVar8[uVar24 + 4] = (char)(psVar30[uVar24] << 4) >> 7 & bVar2;
                psVar8[uVar24 + 5] = (char)(psVar30[uVar24] << 5) >> 7 & bVar2;
                psVar8[uVar24 + 6] = (char)(psVar30[uVar24] << 6) >> 7 & bVar2;
                bVar3 = bVar2;
                if ((psVar30[uVar24] & 1) == 0) {
                  bVar3 = 0;
                }
                psVar8[uVar24 + 7] = bVar3;
                iVar7 = iVar16 + -8;
                psVar30 = psVar30 + 1;
                psVar8 = psVar8 + 8;
                bVar35 = 0xf < iVar16;
                iVar16 = iVar7;
              } while (bVar35);
              pbVar31 = psVar30 + uVar24;
              pbVar27 = psVar8 + uVar24;
            }
            if (0 < iVar7) {
              *pbVar27 = (char)*pbVar31 >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (1 < iVar7) {
              *pbVar27 = (char)(*pbVar31 * '\x02') >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (2 < iVar7) {
              *pbVar27 = (char)(*pbVar31 << 2) >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (3 < iVar7) {
              *pbVar27 = (char)(*pbVar31 << 3) >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (4 < iVar7) {
              *pbVar27 = (char)(*pbVar31 << 4) >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (5 < iVar7) {
              *pbVar27 = (char)(*pbVar31 << 5) >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (iVar7 == 7) {
              bVar2 = (char)(*pbVar31 << 6) >> 7 & bVar2;
              goto LAB_001657d8;
            }
          }
          if (a_00 != out_n) {
            psVar8 = a->out;
            if (a_00 == 1) {
              lVar29 = lVar19;
              if (-1 < (int)uVar22) {
                do {
                  psVar8[lVar29 * 2 + (uVar24 - 1)] = 0xff;
                  psVar8[lVar29 * 2 + (uVar24 - 2)] = psVar8[lVar29 + (uVar24 - 1)];
                  lVar33 = lVar29 + -1;
                  bVar35 = 0 < lVar29;
                  lVar29 = lVar33;
                } while (lVar33 != 0 && bVar35);
              }
            }
            else if (-1 < (int)uVar22) {
              psVar30 = psVar8 + (ulong)uVar22 * 3 + 2 + uVar24;
              lVar29 = lVar19;
              do {
                psVar8[lVar29 * 4 + (uVar24 - 1)] = 0xff;
                psVar8[lVar29 * 4 + (uVar24 - 2)] = *psVar30;
                psVar8[lVar29 * 4 + (uVar24 - 3)] = psVar30[-1];
                psVar8[lVar29 * 4 + (uVar24 - 4)] = psVar30[-2];
                psVar30 = psVar30 + -3;
                lVar33 = lVar29 + -1;
                bVar35 = 0 < lVar29;
                lVar29 = lVar33;
              } while (lVar33 != 0 && bVar35);
            }
          }
          uVar34 = uVar34 + 1;
          uVar11 = uVar11 + uVar5;
          if (uVar34 == y) {
            return 1;
          }
        } while( true );
      }
      pcVar9 = "not enough pixels";
    }
  }
  *(char **)(in_FS_OFFSET + -0x408) = pcVar9;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }
   }